

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_chop_u32(nng_msg *m,uint32_t *vp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  void *pvVar6;
  uint32_t v;
  uint8_t *body;
  uint32_t *vp_local;
  nng_msg *m_local;
  
  sVar5 = nni_msg_len(m);
  if (sVar5 < 4) {
    m_local._4_4_ = 3;
  }
  else {
    pvVar6 = nni_msg_body(m);
    sVar5 = nni_msg_len(m);
    bVar1 = *(byte *)((long)pvVar6 + (sVar5 - 4));
    bVar2 = *(byte *)((long)pvVar6 + (sVar5 - 3));
    bVar3 = *(byte *)((long)pvVar6 + (sVar5 - 2));
    bVar4 = *(byte *)((long)pvVar6 + (sVar5 - 1));
    nni_msg_chop(m,4);
    *vp = (uint)bVar1 * 0x1000000 + (uint)bVar2 * 0x10000 + (uint)bVar3 * 0x100 + (uint)bVar4;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int
nng_msg_chop_u32(nng_msg *m, uint32_t *vp)
{
	uint8_t *body;
	uint32_t v;
	if (nni_msg_len(m) < sizeof(*vp)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	body += nni_msg_len(m);
	body -= sizeof(v);
	NNI_GET32(body, v);
	(void) nni_msg_chop(m, sizeof(v));
	*vp = v;
	return (0);
}